

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmFunctionAccess(ExpressionContext *ctx,VmModule *module,ExprFunctionAccess *node)

{
  TypeFunction *pTVar1;
  VmConstant *el0;
  VmValue *pVVar2;
  VmType type;
  VmValue *in_stack_ffffffffffffffe0;
  
  if (node->function->vmFunction == (VmFunction *)0x0) {
    __assert_fail("node->function->vmFunction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe70,
                  "VmValue *CompileVmFunctionAccess(ExpressionContext &, VmModule *, ExprFunctionAccess *)"
                 );
  }
  if (node->context == (ExprBase *)0x0) {
    el0 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
  }
  else {
    el0 = (VmConstant *)CompileVm(ctx,module,node->context);
  }
  pTVar1 = node->function->type;
  if (pTVar1 != (TypeFunction *)0x0) {
    type.structType = &pTVar1->super_TypeBase;
    type.type = VM_TYPE_FUNCTION_REF;
    type.size = 0xc;
    pVVar2 = anon_unknown.dwarf_13465d::CreateConstruct
                       (module,(node->super_ExprBase).source,type,&el0->super_VmValue,
                        &node->function->vmFunction->super_VmValue,(VmValue *)0x0,
                        in_stack_ffffffffffffffe0);
    pVVar2 = anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,pVVar2);
    return pVVar2;
  }
  __assert_fail("structType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                ,0xd4,"static const VmType VmType::FunctionRef(TypeBase *)");
}

Assistant:

VmValue* CompileVmFunctionAccess(ExpressionContext &ctx, VmModule *module, ExprFunctionAccess *node)
{
	assert(node->function->vmFunction);

	VmValue *context = node->context ? CompileVm(ctx, module, node->context) : CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false);

	VmValue *funcRef = CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), context, node->function->vmFunction, NULL, NULL);

	return CheckType(ctx, node, funcRef);
}